

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QSet<QWidget_*> __thiscall QDockAreaLayout::usedSeparatorWidgets(QDockAreaLayout *this)

{
  long lVar1;
  int iVar2;
  qsizetype qVar3;
  QSet<QWidget_*> *in_RSI;
  Hash in_RDI;
  long in_FS_OFFSET;
  QDockAreaLayoutInfo *dock;
  int i_1;
  int i;
  int numSeparators;
  QSet<QWidget_*> *result;
  QSet<QWidget_*> *in_stack_ffffffffffffffa8;
  int local_30;
  int local_2c;
  uint3 in_stack_ffffffffffffffdc;
  uint uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (uint)in_stack_ffffffffffffffdc;
  *(undefined1 **)in_RDI.d = &DAT_aaaaaaaaaaaaaaaa;
  QSet<QWidget_*>::QSet((QSet<QWidget_*> *)0x57cbab);
  qVar3 = QList<QWidget_*>::size((QList<QWidget_*> *)(in_RSI + 0x41));
  iVar2 = (int)qVar3;
  QSet<QWidget_*>::reserve((QSet<QWidget_*> *)in_RDI.d,(qsizetype)in_stack_ffffffffffffffa8);
  for (local_2c = 0; local_2c < iVar2; local_2c = local_2c + 1) {
    QList<QWidget_*>::at((QList<QWidget_*> *)in_RDI.d,(qsizetype)in_stack_ffffffffffffffa8);
    QSet<QWidget_*>::operator<<(in_RSI,(QWidget **)in_RDI.d);
  }
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    QDockAreaLayoutInfo::usedSeparatorWidgets((QDockAreaLayoutInfo *)CONCAT44(uVar4,iVar2));
    QSet<QWidget_*>::operator+=((QSet<QWidget_*> *)in_RDI.d,in_stack_ffffffffffffffa8);
    QSet<QWidget_*>::~QSet((QSet<QWidget_*> *)0x57cc71);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QSet<QWidget_*>)(Hash)in_RDI.d;
}

Assistant:

QSet<QWidget*> QDockAreaLayout::usedSeparatorWidgets() const
{
    QSet<QWidget*> result;
    const int numSeparators = separatorWidgets.size();
    result.reserve(numSeparators);
    for (int i = 0; i < numSeparators; ++i)
        result << separatorWidgets.at(i);
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        result += dock.usedSeparatorWidgets();
    }
    return result;
}